

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void fdump_action(FILE *out,stone_type stone,response_cache_element *resp,int a,char *indent)

{
  _proto_action *p_Var1;
  _proto_action *p_Var2;
  CMConnection_conflict p_Var3;
  FMFormat *pp_Var4;
  void *__ptr;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sStack_30;
  
  if ((resp != (response_cache_element *)0x0) && (resp->action_type == Action_NoAction)) {
    pcVar7 = "NO ACTION REGISTERED\n";
    sStack_30 = 0x15;
    goto LAB_00131ef8;
  }
  p_Var2 = stone->proto_actions;
  lVar5 = (long)a;
  p_Var1 = p_Var2 + lVar5;
  fprintf((FILE *)out," Action %d - %s  ",lVar5,action_str[p_Var2[lVar5].action_type]);
  switch(p_Var2[lVar5].data_state) {
  case Accepts_All:
    pcVar7 = "accepts any encode state\n";
    sStack_30 = 0x19;
    break;
  case Requires_Decoded:
    pcVar7 = "requires decoded\n";
    sStack_30 = 0x11;
    break;
  case Requires_Contig_Encoded:
    pcVar7 = "requires contiguous encoded\n";
    sStack_30 = 0x1c;
    break;
  case Requires_Vector_Encoded:
    pcVar7 = "requires vector encoded\n";
    sStack_30 = 0x18;
    break;
  default:
    goto switchD_00131d05_default;
  }
  fwrite(pcVar7,sStack_30,1,(FILE *)out);
switchD_00131d05_default:
  fwrite("  expects formats ",0x12,1,(FILE *)out);
  pp_Var4 = p_Var1->matching_reference_formats;
  if (pp_Var4 == (FMFormat *)0x0) {
    fwrite(" NULL",5,1,(FILE *)out);
  }
  else {
    lVar5 = 0;
    while (*(long *)((long)pp_Var4 + lVar5) != 0) {
      __ptr = (void *)global_name_of_FMFormat();
      fprintf((FILE *)out,"\"%s\" (%p), ",__ptr,
              *(undefined8 *)((long)p_Var1->matching_reference_formats + lVar5));
      free(__ptr);
      lVar5 = lVar5 + 8;
      pp_Var4 = p_Var1->matching_reference_formats;
    }
  }
  fputc(10,(FILE *)out);
  switch(p_Var1->action_type) {
  case Action_Bridge:
    pcVar7 = (p_Var1->o).bri.remote_path;
    pcVar6 = "NULL";
    if (pcVar7 != (char *)0x0) {
      pcVar6 = pcVar7;
    }
    fprintf((FILE *)out,"  Target: %s: connection %p, remote_stone_id %d\n",pcVar6,
            (p_Var1->o).term.handler,(ulong)(uint)(p_Var1->o).bri.remote_stone_id);
    p_Var3 = (p_Var1->o).bri.conn;
    if (p_Var3 != (CMConnection_conflict)0x0) {
      fdump_attr_list(out,p_Var3->attrs);
    }
    if ((p_Var1->o).bri.conn_failed == 0) {
      return;
    }
    pcVar7 = "Connection has FAILED!\n";
    sStack_30 = 0x17;
    break;
  case Action_Thread_Bridge:
    fprintf((FILE *)out,"  Target: CManager %p, stone_id %d\n",(p_Var1->o).term.client_data,
            (ulong)(uint)(p_Var1->o).thr_bri.target_stone_id);
    if ((p_Var1->o).term.target_stone_id == 0) {
      return;
    }
    pcVar7 = "TARGET CM HAS SHUTDOWN!\n";
    sStack_30 = 0x18;
    break;
  case Action_Terminal:
  case Action_Filter:
    return;
  case Action_Immediate:
    pcVar7 = "   Immediate action\n";
    sStack_30 = 0x14;
    goto LAB_00131eaa;
  case Action_Multi:
    pcVar7 = "   Multi action\n";
    sStack_30 = 0x10;
LAB_00131eaa:
    fwrite(pcVar7,sStack_30,1,(FILE *)out);
    dump_mrd((p_Var1->o).term.handler);
    return;
  case Action_Decode:
    pcVar7 = "   Decoding action\n";
    sStack_30 = 0x13;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                  ,0x5c5,
                  "void fdump_action(FILE *, stone_type, response_cache_element *, int, const char *)"
                 );
  case Action_Split:
    pcVar7 = "    Split action\n";
    sStack_30 = 0x11;
    break;
  case Action_Store:
    fprintf((FILE *)out,"   Store action: %d/%d items\n",
            (ulong)(uint)(p_Var1->o).term.target_stone_id,(ulong)(uint)(p_Var1->o).store.max_stored)
    ;
  case Action_NoAction:
    pcVar7 = "   NoAction\n";
    sStack_30 = 0xc;
  }
LAB_00131ef8:
  fwrite(pcVar7,sStack_30,1,(FILE *)out);
  return;
}

Assistant:

static void
fdump_action(FILE* out, stone_type stone, response_cache_element *resp, int a, const char *indent)
{
    proto_action *act;
    (void)indent;
    if ((resp != NULL) && (resp->action_type == Action_NoAction)) {
	fprintf(out, "NO ACTION REGISTERED\n");
	return;
    }
    act = &stone->proto_actions[a];
    fprintf(out, " Action %d - %s  ", a, action_str[act->action_type]);
    if (act->data_state == Accepts_All) {
	fprintf(out, "accepts any encode state\n");
    } else if (act->data_state == Requires_Decoded) {
	fprintf(out, "requires decoded\n");
    } else if (act->data_state == Requires_Contig_Encoded) {
	fprintf(out, "requires contiguous encoded\n");
    } else if (act->data_state == Requires_Vector_Encoded) {
	fprintf(out, "requires vector encoded\n");
    }
    fprintf(out, "  expects formats ");
    if (act->matching_reference_formats) {
	int i = 0;
	while (act->matching_reference_formats[i] != NULL) {
	    char *tmp;
	    fprintf(out, "\"%s\" (%p), ", tmp = global_name_of_FMFormat(act->matching_reference_formats[i]), act->matching_reference_formats[i]);
	    i++;
	    free(tmp);
	}
    } else {
	fprintf(out, " NULL");
    }
    fprintf(out, "\n");
    switch(act->action_type) {
    case Action_Bridge:
	fprintf(out, "  Target: %s: connection %p, remote_stone_id %d\n",
	       (act->o.bri.remote_path ? act->o.bri.remote_path : "NULL" ),
	       (void*)act->o.bri.conn, act->o.bri.remote_stone_id);
	if (act->o.bri.conn != NULL) fdump_attr_list(out, act->o.bri.conn->attrs);
	if (act->o.bri.conn_failed) fprintf(out, "Connection has FAILED!\n");
	break;
    case Action_Thread_Bridge:
	fprintf(out, "  Target: CManager %p, stone_id %d\n",
	       act->o.thr_bri.target_cm, act->o.thr_bri.target_stone_id);
	if (act->o.thr_bri.target_cm_shutdown) fprintf(out, "TARGET CM HAS SHUTDOWN!\n");
	break;
    case Action_Terminal:
	break;
    case Action_Filter:
/*	printf("  Filter proto action number %d\n",
	act->proto_action_id);*/
	break;
    case Action_Decode:
	fprintf(out, "   Decoding action\n");
	break;
    case Action_Split:
	fprintf(out, "    Split action\n");
	break;
    case Action_Immediate: 
	fprintf(out, "   Immediate action\n");
	dump_mrd(act->o.imm.mutable_response_data);
	break;
    case Action_Store:
        fprintf(out, "   Store action: %d/%d items\n", act->o.store.num_stored, 
                    act->o.store.max_stored);
    case Action_NoAction:
	fprintf(out, "   NoAction\n");
	break;
    case Action_Multi:
	fprintf(out, "   Multi action\n");
	dump_mrd(act->o.imm.mutable_response_data);
	break;
    default:
	assert(FALSE);
    }
}